

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O3

transaction_base * __thiscall pstore::transaction_base::commit(transaction_base *this)

{
  int iVar1;
  typed_address<pstore::trailer> addr;
  long lVar2;
  uint32_t uVar3;
  uint64_t uVar4;
  shared_ptr<const_pstore::trailer> prev_footer;
  index_records_array locations;
  undefined1 local_90 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  unique_ptr<pstore::system_page_size_interface,_std::default_delete<pstore::system_page_size_interface>_>
  local_70;
  index_records_array local_68;
  
  if ((this->first_).a_ != 0) {
    addr.a_.a_ = (address)this->db_;
    lVar2 = *(long *)((long)addr.a_.a_ + 0x48);
    database::getro<pstore::trailer,void>((database *)local_90,addr,*(size_t *)(lVar2 + 0x28));
    iVar1 = *(int *)(local_90._0_8_ + 8);
    local_68._M_elems[0].a_.a_ =
         *(address *)
          &((__uniq_ptr_impl<pstore::region::factory,_std::default_delete<pstore::region::factory>_>
             *)(local_90._0_8_ + 0x28))->_M_t;
    local_68._M_elems[1].a_.a_ = *(address *)(local_90._0_8_ + 0x30);
    local_68._M_elems[2].a_.a_ = *(address *)(local_90._0_8_ + 0x38);
    local_68._M_elems[3].a_.a_ = *(address *)(local_90._0_8_ + 0x40);
    local_68._M_elems[4].a_.a_ = *(address *)(local_90._0_8_ + 0x48);
    local_68._M_elems[5].a_.a_ = *(address *)(local_90._0_8_ + 0x50);
    pstore::index::flush_indices(this,&local_68,iVar1 + 1U);
    alloc_rw<pstore::trailer,void>
              ((pair<std::shared_ptr<pstore::trailer>,_pstore::typed_address<pstore::trailer>_> *)
               (local_90 + 0x10),this,1);
    *(undefined8 *)(((body *)local_90._16_8_)->signature1)._M_elems = 0x546f6f6679505068;
    ((body *)local_90._16_8_)->generation = (__atomic_base<unsigned_int>)0x0;
    ((body *)local_90._16_8_)->unused1 = 0;
    (((body *)local_90._16_8_)->size).super___atomic_base<unsigned_long>._M_i = 0;
    (((body *)local_90._16_8_)->time).super___atomic_base<unsigned_long>._M_i = 0;
    (((body *)local_90._16_8_)->prev_generation).a_.a_ = 0;
    (((body *)local_90._16_8_)->index_records)._M_elems[0].a_.a_ = 0;
    (((body *)local_90._16_8_)->index_records)._M_elems[1].a_.a_ = 0;
    (((body *)local_90._16_8_)->index_records)._M_elems[2].a_.a_ = 0;
    (((body *)local_90._16_8_)->index_records)._M_elems[3].a_.a_ = 0;
    (((body *)local_90._16_8_)->index_records)._M_elems[4].a_.a_ = 0;
    (((body *)local_90._16_8_)->index_records)._M_elems[5].a_.a_ = 0;
    ((body *)local_90._16_8_)->unused2 = 0;
    ((body *)local_90._16_8_)->unused3 = 0;
    *(undefined8 *)(local_90._16_8_ + 0x60) = 0;
    *(undefined8 *)((array<unsigned_char,_8UL> *)(local_90._16_8_ + 0x68))->_M_elems =
         0x6c69615479505068;
    (((body *)local_90._16_8_)->index_records)._M_elems[0].a_.a_ =
         (value_type)local_68._M_elems[0].a_.a_;
    (((body *)local_90._16_8_)->index_records)._M_elems[1].a_.a_ =
         (value_type)local_68._M_elems[1].a_.a_;
    (((body *)local_90._16_8_)->index_records)._M_elems[2].a_.a_ =
         (value_type)local_68._M_elems[2].a_.a_;
    (((body *)local_90._16_8_)->index_records)._M_elems[3].a_.a_ =
         (value_type)local_68._M_elems[3].a_.a_;
    (((body *)local_90._16_8_)->index_records)._M_elems[4].a_.a_ =
         (value_type)local_68._M_elems[4].a_.a_;
    (((body *)local_90._16_8_)->index_records)._M_elems[5].a_.a_ =
         (value_type)local_68._M_elems[5].a_.a_;
    LOCK();
    (((body *)local_90._16_8_)->generation).super___atomic_base<unsigned_int>._M_i = iVar1 + 1U;
    UNLOCK();
    LOCK();
    (((body *)local_90._16_8_)->size).super___atomic_base<unsigned_long>._M_i = this->size_ - 0x70;
    UNLOCK();
    uVar4 = milliseconds_since_epoch();
    LOCK();
    (((body *)local_90._16_8_)->time).super___atomic_base<unsigned_long>._M_i = uVar4;
    UNLOCK();
    (((body *)local_90._16_8_)->prev_generation).a_.a_ = *(value_type *)(lVar2 + 0x28);
    uVar3 = trailer::get_crc((trailer *)local_90._16_8_);
    *(uint32_t *)(local_90._16_8_ + 0x60) = uVar3;
    if (local_78._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78._M_pi);
    }
    if ((tuple<std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
         )local_90._8_8_ != (_Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_);
    }
    database::set_new_footer
              ((database *)addr.a_.a_,
               (typed_address<pstore::trailer>)
               local_70._M_t.
               super___uniq_ptr_impl<pstore::system_page_size_interface,_std::default_delete<pstore::system_page_size_interface>_>
               ._M_t.
               super__Tuple_impl<0UL,_pstore::system_page_size_interface_*,_std::default_delete<pstore::system_page_size_interface>_>
               .super__Head_base<0UL,_pstore::system_page_size_interface_*,_false>._M_head_impl);
    storage::protect((storage *)((long)addr.a_.a_ + 8),(address)(this->first_).a_,
                     (address)((long)local_70._M_t.
                                     super___uniq_ptr_impl<pstore::system_page_size_interface,_std::default_delete<pstore::system_page_size_interface>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_pstore::system_page_size_interface_*,_std::default_delete<pstore::system_page_size_interface>_>
                                     .
                                     super__Head_base<0UL,_pstore::system_page_size_interface_*,_false>
                                     ._M_head_impl + 0x70));
    (this->first_).a_ = 0;
  }
  return this;
}

Assistant:

transaction_base & transaction_base::commit () {
        if (!this->is_open ()) {
            // No data was added to the transaction. Nothing to do.
            return *this;
        }

        database & db = this->db ();

        // We're going to write to the header, but this must be the very last
        // step of completing the transaction.
        auto new_footer_pos = typed_address<trailer>::null ();
        {
            auto const & head = db.get_header ();
            auto const prev_footer = db.getro (head.footer_pos.load ());

            unsigned const generation = prev_footer->a.generation + 1;

            // Make a copy of the index locations; write out any modifications to the indices.
            // Any updated indices will modify the 'locations' array.
            //
            // This must happen before the transaction is final because we're allocating and
            // writing data here.

            auto locations = prev_footer->a.index_records;
            index::flush_indices (*this, &locations, generation);

            // Writing new data is done. Now we begin to build the new file footer.
            {
                std::shared_ptr<trailer> trailer_ptr;
                std::tie (trailer_ptr, new_footer_pos) = this->alloc_rw<trailer> ();
                auto * const t = new (trailer_ptr.get ()) trailer;

                t->a.index_records = locations;

                // Point the new header at the previous version.
                t->a.generation = generation;
                // The size of the transaction doesn't include the size of the footer record.
                t->a.size = size_ - sizeof (trailer);
                t->a.time = pstore::milliseconds_since_epoch ();
                t->a.prev_generation = head.footer_pos;
                t->crc = t->get_crc ();
            }
        }
        // Complete the transaction by making it available to other clients. This modifies the
        // footer pointer in the file's header record.
        db.set_new_footer (new_footer_pos);

        // Mark both this transaction's contents and its trailer as read-only.
        db.protect (first_, (new_footer_pos + 1).to_address ());

        // That's the end of this transaction.
        first_ = address::null ();
        PSTORE_ASSERT (!this->is_open ()); //! OCLINT(PH - don't warn about the assert macro)
        return *this;
    }